

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCase::swap(TestCase *this,TestCase *other)

{
  Ptr<Catch::ITestCase> *in_RSI;
  string *in_RDI;
  SourceLineInfo *in_stack_00000018;
  SourceLineInfo *in_stack_00000020;
  
  Ptr<Catch::ITestCase>::swap(in_RSI,(Ptr<Catch::ITestCase> *)in_RDI);
  std::__cxx11::string::swap(in_RDI + 0x20);
  std::__cxx11::string::swap(in_RDI);
  std::__cxx11::string::swap(in_RDI + 0x40);
  std::swap<Catch::SourceLineInfo>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void TestCase::swap( TestCase& other ) {
        test.swap( other.test );
        className.swap( other.className );
        name.swap( other.name );
        description.swap( other.description );
        std::swap( lineInfo, other.lineInfo );
    }